

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_config_voice(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  char *__dest;
  char *in_RSI;
  long in_RDI;
  char full [260];
  uint c;
  char name_extended [260];
  char temp [260];
  char path [260];
  Open_JTalk *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  char local_458 [268];
  undefined4 local_34c;
  char local_348 [240];
  char *in_stack_fffffffffffffda8;
  char local_238 [20];
  uint in_stack_fffffffffffffddc;
  uint *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  char local_128 [272];
  char *local_18;
  long local_10;
  _Bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (g_verbose) {
    console_message((char *)0x19655f);
  }
  clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
  strcpy(local_128,local_18);
  if (local_10 == 0) {
    local_1 = false;
  }
  else {
    sVar2 = strlen(local_128);
    if (sVar2 == 0) {
      local_1 = false;
    }
    else {
      clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      _Var1 = is_name_only((char *)full._216_8_);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        in_stack_fffffffffffffba0 = (char *)strlen(local_128);
        sVar2 = strlen(G_VOICE_EXT);
        if ((char *)0x104 < in_stack_fffffffffffffba0 + sVar2 + 1) {
          return false;
        }
        __dest = strcpy(local_348,local_128);
        strcat(__dest,G_VOICE_EXT);
        local_34c = 0;
        _Var1 = search_file_recursive
                          (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                           in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                           in_stack_fffffffffffffddc);
        if (!_Var1) {
          return false;
        }
      }
      else {
        _Var1 = is_relative(in_stack_fffffffffffffda8);
        if (_Var1) {
          if ((g_verbose & 1U) != 0) {
            console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
          }
          sVar2 = strlen(g_ini_dir);
          if (sVar2 == 0) {
            return false;
          }
          sVar2 = strlen(g_ini_dir);
          in_stack_fffffffffffffb98 = (Open_JTalk *)(sVar2 + 1);
          sVar2 = strlen(local_128);
          if ((char *)0x104 <
              (char *)((long)&(in_stack_fffffffffffffb98->mecab).feature + sVar2 + 1)) {
            return false;
          }
          strcpy(local_238,g_ini_dir);
          strcat(local_238,G_SLASH_CHAR);
          strcat(local_238,local_128);
        }
        else {
          if ((g_verbose & 1U) != 0) {
            console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
          }
          strcpy(local_238,local_128);
        }
        _Var1 = exists_file((char *)in_stack_fffffffffffffb98);
        if (!_Var1) {
          if ((g_verbose & 1U) != 0) {
            console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
          }
          return false;
        }
      }
      clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      get_fullpath((char *)in_stack_fffffffffffffb98,(char *)0x196835);
      strcpy((char *)(local_10 + 0x210),local_458);
      Open_JTalk_load_voice(in_stack_fffffffffffffb98,(char *)0x196863);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool set_config_voice(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から音響モデルファイルを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_name_only(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイルは名前のみの指定です。： %s\n", path);
		}

		if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
		{
			return false;
		}

		char name_extended[MAX_PATH];
		strcat(strcpy(name_extended, path), G_VOICE_EXT);
		unsigned int c = 0;
		if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
		{
			goto return_true;
		}
		return false;
	}

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイル指定は相対指定です： %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイル指定は相対指定ではありません： %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_file(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"指定された音響モデルファイルは存在しません： %s\n", temp);
		}
		return false;
	}

	char full[MAX_PATH];
return_true:
	clear_path_string(full, MAX_PATH);
	get_fullpath(temp, full);
	strcpy(oj->fn_voice_path, full);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(full, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, full);
#endif
	return true;
}